

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorTemplateBase<void_*,_true>::push_back
          (SmallVectorTemplateBase<void_*,_true> *this,void **Elt)

{
  uint uVar1;
  
  if ((this->super_SmallVectorTemplateCommon<void_*,_void>).super_SmallVectorBase.Capacity <=
      (this->super_SmallVectorTemplateCommon<void_*,_void>).super_SmallVectorBase.Size) {
    SmallVectorTemplateBase<void*,true>::push_back(this);
  }
  *(void **)((long)(this->super_SmallVectorTemplateCommon<void_*,_void>).super_SmallVectorBase.
                   BeginX +
            (ulong)(this->super_SmallVectorTemplateCommon<void_*,_void>).super_SmallVectorBase.Size
            * 8) = *Elt;
  uVar1 = (this->super_SmallVectorTemplateCommon<void_*,_void>).super_SmallVectorBase.Size;
  if (uVar1 < (this->super_SmallVectorTemplateCommon<void_*,_void>).super_SmallVectorBase.Capacity)
  {
    (this->super_SmallVectorTemplateCommon<void_*,_void>).super_SmallVectorBase.Size = uVar1 + 1;
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(this->end(), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }